

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O3

void foreach_bit(bit_vec v,bv_func func,void *p1,void *p2)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  if (0 < v->len) {
    lVar2 = 0;
    do {
      uVar6 = (int)lVar2 * 8;
      uVar4 = 0;
      bVar1 = true;
      do {
        bVar3 = bVar1;
        switch((int)v->vec[lVar2] >> (sbyte)uVar4 & 0xf) {
        case 0:
          goto switchD_0010cdf3_caseD_0;
        case 1:
          uVar4 = uVar4 | uVar6;
          break;
        case 2:
          uVar4 = uVar6 + uVar4 + 1;
          break;
        case 3:
          iVar5 = uVar6 + uVar4 + 1;
          goto LAB_0010cf1d;
        case 4:
          uVar4 = uVar6 + uVar4 + 2;
          break;
        case 5:
          iVar5 = uVar6 + uVar4 + 2;
          goto LAB_0010cf1d;
        case 6:
          iVar5 = uVar6 + uVar4 + 2;
          goto LAB_0010cf3d;
        case 7:
          iVar5 = uVar6 + uVar4 + 2;
          goto LAB_0010cecb;
        case 8:
          uVar4 = uVar6 + uVar4 + 3;
          break;
        case 9:
          iVar5 = uVar6 + uVar4 + 3;
          goto LAB_0010cf1d;
        case 10:
          iVar5 = uVar6 + uVar4 + 3;
          goto LAB_0010cf3d;
        case 0xb:
          iVar5 = uVar6 + uVar4 + 3;
          goto LAB_0010cecb;
        case 0xc:
          (*func)(uVar6 + uVar4 + 3,p1,p2);
          uVar4 = uVar6 + uVar4 + 2;
          break;
        case 0xd:
          (*func)(uVar6 + uVar4 + 3,p1,p2);
          iVar5 = uVar6 + uVar4 + 2;
          goto LAB_0010cf1d;
        case 0xe:
          (*func)(uVar6 + uVar4 + 3,p1,p2);
          iVar5 = uVar6 + uVar4 + 2;
LAB_0010cf3d:
          (*func)(iVar5,p1,p2);
          uVar4 = uVar6 + uVar4 + 1;
          break;
        case 0xf:
          (*func)(uVar6 + uVar4 + 3,p1,p2);
          iVar5 = uVar6 + uVar4 + 2;
LAB_0010cecb:
          (*func)(iVar5,p1,p2);
          iVar5 = uVar6 + uVar4 + 1;
LAB_0010cf1d:
          uVar4 = uVar4 | uVar6;
          (*func)(iVar5,p1,p2);
        }
        (*func)(uVar4,p1,p2);
switchD_0010cdf3_caseD_0:
        uVar4 = 4;
        bVar1 = false;
      } while (bVar3);
      lVar2 = lVar2 + 1;
    } while (lVar2 < v->len);
  }
  return;
}

Assistant:

void
foreach_bit(bit_vec v, bv_func func, void* p1, void* p2)
{
    int i;
    for (i = 0; i < v->len; i++) {
        int j;
        for (j = 0; j < 2; j++) {
            unsigned char nibble = (v->vec[i] >> (j * 4)) & 0xf;
            switch (nibble) {
            case 0xf:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xe:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0xd:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xc:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                break;
            case 0xb:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xa:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x9:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x8:
                func(i * 8 + j * 4 + 3, p1, p2);
                break;
            case 0x7:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x6:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x5:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x4:
                func(i * 8 + j * 4 + 2, p1, p2);
                break;
            case 0x3:
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x2:
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x1:
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x0:
                break;
            }
        }
    }
}